

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamIGA::ComputeGravityForces
          (ChElementBeamIGA *this,ChVectorDynamic<> *Fg,ChVector<double> *G_acc)

{
  pointer psVar1;
  pointer psVar2;
  Index IVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined8 *puVar7;
  long cols;
  ulong uVar8;
  long rows;
  double *pdVar9;
  Index index;
  ulong uVar10;
  ulong uVar11;
  ChVectorDynamic<> mG;
  ChMatrixDynamic<> mM;
  assign_op<double,_double> local_99;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_98;
  DenseStorage<double,__1,__1,__1,_1> local_88;
  double *local_68;
  ulong uStack_60;
  ulong uStack_58;
  ulong uStack_50;
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_40;
  
  uVar4 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])();
  uVar5 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  local_88.m_data = (double *)0x0;
  local_88.m_rows = 0;
  local_88.m_cols = 0;
  rows = (long)(int)uVar4;
  cols = (long)(int)uVar5;
  if ((int)(uVar5 | uVar4) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  if (((uVar4 != 0) && (uVar5 != 0)) &&
     (SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(cols),0) < rows)) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = std::ostream::_M_insert<bool>;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_88,cols * rows,rows,cols);
  uStack_50 = 0;
  local_68 = local_88.m_data;
  uStack_60 = local_88.m_rows;
  uStack_58 = local_88.m_cols;
  if ((local_88.m_rows | local_88.m_cols) < 0 && local_88.m_data != (double *)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                 );
  }
  uStack_50 = local_88.m_cols;
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[7])
            (this);
  iVar6 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  local_98.m_storage.m_data = (double *)0x0;
  local_98.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_98,(long)iVar6);
  IVar3 = local_98.m_storage.m_rows;
  if (-1 < local_98.m_storage.m_rows) {
    if (local_98.m_storage.m_rows != 0) {
      memset(local_98.m_storage.m_data,0,local_98.m_storage.m_rows * 8);
    }
    if ((this->nodes).
        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->nodes).
        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      psVar1 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar2 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = 0;
      pdVar9 = local_98.m_storage.m_data;
      do {
        if ((long)(IVar3 - 3U) < (long)(uVar8 * 6)) {
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                        "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                       );
        }
        uVar10 = 3;
        if ((((ulong)local_98.m_storage.m_data & 7) == 0) &&
           (uVar10 = (ulong)(-((uint)((ulong)(local_98.m_storage.m_data + uVar8 * 6) >> 3) &
                              0x1fffffff) & 7), 2 < uVar10)) {
          uVar10 = 3;
        }
        if (uVar10 != 0) {
          uVar11 = 0;
          do {
            pdVar9[uVar11] = G_acc->m_data[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar10 != uVar11);
        }
        if (uVar10 < 3) {
          do {
            pdVar9[uVar10] = G_acc->m_data[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar10 != 3);
        }
        uVar8 = uVar8 + 1;
        pdVar9 = pdVar9 + 6;
      } while (uVar8 < (ulong)((long)psVar1 - (long)psVar2 >> 4));
    }
    if (local_88.m_cols == IVar3) {
      local_40.m_lhs = (LhsNested)&local_88;
      local_40.m_rhs = (RhsNested)&local_98;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
                (Fg,&local_40,&local_99,(type)0x0);
      if (local_98.m_storage.m_data != (double *)0x0) {
        free((void *)local_98.m_storage.m_data[-1]);
      }
      if (local_88.m_data != (double *)0x0) {
        free((void *)local_88.m_data[-1]);
      }
      return;
    }
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                 );
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

void ChElementBeamIGA::ComputeGravityForces(ChVectorDynamic<>& Fg, const ChVector<>& G_acc) {
    // no so efficient... a temporary mass matrix here:
    ChMatrixDynamic<> mM(this->GetNdofs(), this->GetNdofs());
    this->ComputeMmatrixGlobal(mM);

    // a vector of G accelerations (for translation degrees of freedom ie 3 xyz every 6 values)
    ChVectorDynamic<> mG(this->GetNdofs());
    mG.setZero();
    for (int i = 0; i < nodes.size(); ++i) {
        mG.segment(i * 6, 3) = G_acc.eigen();
    }

    // Gravity forces as M*g, always works, regardless of the way M
    // is computed (lumped or consistent, with offset center of mass or centered, etc.)
    // [Maybe one can replace this function with a faster ad-hoc implementation in case of lumped masses.]
    Fg = mM * mG;
}